

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void save_predictor(vw *all,string *reg_name,size_t current_pass)

{
  ostream *poVar1;
  stringstream filename;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,(string *)reg_name);
  if (all->save_per_pass == true) {
    poVar1 = std::operator<<(&local_198,".");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  dump_regressor(all,&sStack_1c8,false);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void save_predictor(vw& all, string reg_name, size_t current_pass)
{
  stringstream filename;
  filename << reg_name;
  if (all.save_per_pass)
    filename << "." << current_pass;
  dump_regressor(all, filename.str(), false);
}